

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

void __thiscall
CVmObjStringBuffer::splice_move(CVmObjStringBuffer *this,int32_t idx,int32_t del,int32_t ins)

{
  int *piVar1;
  int iVar2;
  
  if (ins - del != 0 && del <= ins) {
    ensure_added_space(this,ins - del);
  }
  if (ins - del != 0) {
    piVar1 = (int *)(this->super_CVmObject).ext_;
    iVar2 = *piVar1 - (del + idx);
    if (iVar2 != 0 && del + idx <= *piVar1) {
      memmove(piVar1 + (long)idx + (long)ins + 3,piVar1 + (long)idx + (long)del + 3,(long)iVar2 << 2
             );
    }
  }
  piVar1 = (int *)(this->super_CVmObject).ext_;
  *piVar1 = *piVar1 + (ins - del);
  return;
}

Assistant:

void CVmObjStringBuffer::splice_move(
    VMG_ int32_t idx, int32_t del, int32_t ins)
{
    /* 
     *   if we're adding more than we're deleting, expand the buffer if
     *   necessary to accommodate the added length 
     */
    if (ins > del)
        ensure_added_space(vmg_ ins - del);

    /* 
     *   if we're doing a net insertion or deletion, move the part of the
     *   string after the deleted text so that it'll be aligned at the end of
     *   the inserted text 
     */
    if (ins != del && idx + del < get_ext()->len)
        memmove(get_ext()->buf + idx + ins,
                get_ext()->buf + idx + del,
                (get_ext()->len - (idx + del)) * sizeof(wchar_t));

    /* adjust the buffer length */
    get_ext()->len += ins - del;
}